

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLLinOp.cpp
# Opt level: O0

void __thiscall
amrex::MLLinOp::define
          (MLLinOp *this,Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *a_geom,
          Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *a_grids,
          Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *a_dmap,
          LPInfo *a_info,
          Vector<const_amrex::FabFactory<amrex::FArrayBox>_*,_std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>_>
          *a_factory,bool eb_limit_coarsening)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  FabFactory<amrex::FArrayBox> **ppFVar4;
  int *piVar5;
  MLLinOp *in_RDI;
  undefined8 *in_R8;
  byte in_stack_00000008;
  EBFArrayBoxFactory *f;
  Vector<const_amrex::FabFactory<amrex::FArrayBox>_*,_std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>_>
  *in_stack_00001070;
  Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *in_stack_00001078
  ;
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *in_stack_00001080;
  Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *in_stack_00001088;
  MLLinOp *in_stack_00001090;
  size_type in_stack_ffffffffffffff88;
  MLLinOp *in_stack_ffffffffffffff90;
  vector<const_amrex::FabFactory<amrex::FArrayBox>_*,_std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>_>
  *in_stack_ffffffffffffffa0;
  int local_4c;
  EBFArrayBoxFactory *local_48;
  byte local_39 [9];
  undefined8 *local_30;
  byte *local_8;
  
  local_39[0] = in_stack_00000008 & 1;
  local_8 = local_39;
  local_30 = in_R8;
  if (((anonymous_namespace)::initialized & 1) == 0) {
    Initialize();
  }
  uVar1 = *local_30;
  (in_RDI->info).do_agglomeration = (bool)(char)uVar1;
  (in_RDI->info).do_consolidation = (bool)(char)((ulong)uVar1 >> 8);
  (in_RDI->info).do_semicoarsening = (bool)(char)((ulong)uVar1 >> 0x10);
  (in_RDI->info).field_0x3 = (char)((ulong)uVar1 >> 0x18);
  (in_RDI->info).agg_grid_size = (int)((ulong)uVar1 >> 0x20);
  uVar1 = local_30[1];
  (in_RDI->info).con_grid_size = (int)uVar1;
  (in_RDI->info).has_metric_term = (bool)(char)((ulong)uVar1 >> 0x20);
  *(int3 *)&(in_RDI->info).field_0xd = (int3)((ulong)uVar1 >> 0x28);
  uVar1 = local_30[2];
  (in_RDI->info).max_coarsening_level = (int)uVar1;
  (in_RDI->info).max_semicoarsening_level = (int)((ulong)uVar1 >> 0x20);
  uVar1 = local_30[3];
  (in_RDI->info).semicoarsening_direction = (int)uVar1;
  (in_RDI->info).hidden_direction = (int)((ulong)uVar1 >> 0x20);
  if ((in_RDI->info).agg_grid_size < 1) {
    iVar3 = LPInfo::getDefaultAgglomerationGridSize();
    (in_RDI->info).agg_grid_size = iVar3;
  }
  if ((in_RDI->info).con_grid_size < 1) {
    iVar3 = LPInfo::getDefaultConsolidationGridSize();
    (in_RDI->info).con_grid_size = iVar3;
  }
  bVar2 = std::
          vector<const_amrex::FabFactory<amrex::FArrayBox>_*,_std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>_>
          ::empty(in_stack_ffffffffffffffa0);
  if ((!bVar2) && ((local_39[0] & 1) != 0)) {
    ppFVar4 = Vector<const_amrex::FabFactory<amrex::FArrayBox>_*,_std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>_>
              ::operator[]((Vector<const_amrex::FabFactory<amrex::FArrayBox>_*,_std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>_>
                            *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    if (*ppFVar4 == (FabFactory<amrex::FArrayBox> *)0x0) {
      local_48 = (EBFArrayBoxFactory *)0x0;
    }
    else {
      local_48 = (EBFArrayBoxFactory *)
                 __dynamic_cast(*ppFVar4,&FabFactory<amrex::FArrayBox>::typeinfo,
                                &EBFArrayBoxFactory::typeinfo,0);
    }
    if (local_48 != (EBFArrayBoxFactory *)0x0) {
      in_stack_ffffffffffffff90 = (MLLinOp *)&(in_RDI->info).max_coarsening_level;
      local_4c = EBFArrayBoxFactory::maxCoarseningLevel(local_48);
      piVar5 = std::min<int>((int *)in_stack_ffffffffffffff90,&local_4c);
      (in_RDI->info).max_coarsening_level = *piVar5;
    }
  }
  defineGrids(in_stack_00001090,in_stack_00001088,in_stack_00001080,in_stack_00001078,
              in_stack_00001070);
  defineAuxData(in_RDI);
  defineBC(in_stack_ffffffffffffff90);
  return;
}

Assistant:

void
MLLinOp::define (const Vector<Geometry>& a_geom,
                 const Vector<BoxArray>& a_grids,
                 const Vector<DistributionMapping>& a_dmap,
                 const LPInfo& a_info,
                 const Vector<FabFactory<FArrayBox> const*>& a_factory,
                 bool eb_limit_coarsening)
{
    amrex::ignore_unused(eb_limit_coarsening);

    BL_PROFILE("MLLinOp::define()");

    if (!initialized) {
        Initialize();
    }

    info = a_info;
#ifdef AMREX_USE_GPU
    if (Gpu::notInLaunchRegion())
    {
        if (info.agg_grid_size <= 0) info.agg_grid_size = AMREX_D_PICK(32, 16, 8);
        if (info.con_grid_size <= 0) info.con_grid_size = AMREX_D_PICK(32, 16, 8);
    }
    else
#endif
    {
        if (info.agg_grid_size <= 0) info.agg_grid_size = LPInfo::getDefaultAgglomerationGridSize();
        if (info.con_grid_size <= 0) info.con_grid_size = LPInfo::getDefaultConsolidationGridSize();
    }

#ifdef AMREX_USE_EB
    if (!a_factory.empty() && eb_limit_coarsening) {
        auto f = dynamic_cast<EBFArrayBoxFactory const*>(a_factory[0]);
        if (f) {
            info.max_coarsening_level = std::min(info.max_coarsening_level,
                                                 f->maxCoarseningLevel());
        }
    }
#endif
    defineGrids(a_geom, a_grids, a_dmap, a_factory);
    defineAuxData();
    defineBC();
}